

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmGates.c
# Opt level: O2

Abc_Ntk_t * Mpm_ManDeriveMappedAbcNtk(Mpm_Man_t *p,Mio_Library_t *pMio)

{
  Mig_Man_t *p_00;
  Mmr_Step_t *pMVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Ptr_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Abc_Ntk_t *pNtk;
  char *pcVar5;
  Mig_Obj_t *pMVar6;
  Abc_Obj_t *pAVar7;
  void *pvVar8;
  Vec_Int_t *p_04;
  void *pvVar9;
  Abc_Obj_t *pAVar10;
  byte bVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  
  p_01 = Mpm_ManFindCells(pMio,(SC_Lib *)p->pPars->pScl,p->vNpnConfigs);
  if (p_01 == (Vec_Ptr_t *)0x0) {
    puts("Genlib library does not match SCL library.");
    pNtk = (Abc_Ntk_t *)0x0;
  }
  else {
    iVar13 = p->pMig->nObjs;
    iVar2 = iVar13 * 2;
    p_02 = Vec_IntAlloc(iVar2);
    p_02->nSize = iVar2;
    if (p_02->pArray != (int *)0x0) {
      memset(p_02->pArray,0xff,(long)iVar13 << 3);
    }
    p_03 = Mpm_ManFindMappedNodes(p);
    pNtk = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_MAP,1);
    pcVar5 = Extra_UtilStrsav(p->pMig->pName);
    pNtk->pName = pcVar5;
    pNtk->pManFunc = pMio;
    for (iVar13 = 0; p_00 = p->pMig, iVar13 < (p_00->vCis).nSize; iVar13 = iVar13 + 1) {
      iVar2 = Vec_IntEntry(&p_00->vCis,iVar13);
      pMVar6 = Mig_ManObj(p_00,iVar2);
      if (pMVar6 == (Mig_Obj_t *)0x0) break;
      pAVar7 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
      iVar2 = Abc_Var2Lit((uint)pMVar6->pFans[3] >> 1,0);
      Vec_IntWriteEntry(p_02,iVar2,pAVar7->Id);
    }
    Abc_NtkAddDummyPiNames(pNtk);
    iVar13 = 0;
    do {
      if ((p->pMig->vCos).nSize <= iVar13) goto LAB_003c435b;
      iVar2 = iVar13;
      pMVar6 = Mig_ManCo(p->pMig,iVar13);
      if (pMVar6 == (Mig_Obj_t *)0x0) goto LAB_003c435b;
      iVar2 = Mig_ObjFaninLit(pMVar6,iVar2);
      iVar13 = iVar13 + 1;
    } while (iVar2 != 0);
    pAVar7 = Abc_NtkCreateNodeConst0(pNtk);
    Vec_IntWriteEntry(p_02,0,pAVar7->Id);
LAB_003c435b:
    iVar13 = 0;
    do {
      if ((p->pMig->vCos).nSize <= iVar13) goto LAB_003c4398;
      iVar2 = iVar13;
      pMVar6 = Mig_ManCo(p->pMig,iVar13);
      if (pMVar6 == (Mig_Obj_t *)0x0) goto LAB_003c4398;
      iVar2 = Mig_ObjFaninLit(pMVar6,iVar2);
      iVar13 = iVar13 + 1;
    } while (iVar2 != 1);
    pAVar7 = Abc_NtkCreateNodeConst1(pNtk);
    Vec_IntWriteEntry(p_02,1,pAVar7->Id);
LAB_003c4398:
    iVar13 = p_03->nSize;
    iVar2 = 0;
    if (iVar13 < 1) {
      iVar13 = 0;
    }
    for (; iVar2 != iVar13; iVar2 = iVar2 + 1) {
      iVar3 = Vec_IntEntry(p_03,iVar2);
      pMVar6 = Mig_ManObj(p->pMig,iVar3);
      uVar4 = Vec_IntEntry(&p->vCutBests,(uint)pMVar6->pFans[3] >> 1);
      pMVar1 = p->pManCuts;
      uVar12 = pMVar1->uMask & uVar4;
      if ((int)uVar12 < 1) {
        __assert_fail("(h & p->uMask) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/mem/mem2.h"
                      ,0xee,"word *Mmr_StepEntry(Mmr_Step_t *, int)");
      }
      uVar16 = (int)uVar4 >> ((byte)pMVar1->nBits & 0x1f);
      if ((int)uVar16 < 1) {
LAB_003c4659:
        __assert_fail("h > 0 && h < (Vec_PtrSize(&p->vPages) << p->nPageBase)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/mem/mem2.h"
                      ,0xb2,"word *Mmr_FixedEntry(Mmr_Fixed_t *, int)");
      }
      bVar11 = (byte)*(undefined4 *)((long)pMVar1 + (ulong)uVar12 * 0x38 + 0x18);
      if (*(int *)((long)pMVar1 + (ulong)uVar12 * 0x38 + 0x34) << (bVar11 & 0x1f) <= (int)uVar16)
      goto LAB_003c4659;
      pvVar8 = Vec_PtrEntry((Vec_Ptr_t *)((long)pMVar1 + (ulong)uVar12 * 0x38 + 0x30),
                            uVar16 >> (bVar11 & 0x1f));
      uVar17 = (ulong)(uVar16 & *(uint *)((long)pMVar1 + (ulong)uVar12 * 0x38 + 0x1c));
      uVar12 = *(uint *)((long)pvVar8 + uVar17 * 8 + 4);
      if ((uVar12 >> 0x19) + 0xc >> 3 != (uVar4 & p->pManCuts->uMask)) {
        __assert_fail("Mpm_CutWordNum(pCut->nLeaves) == (h & p->pManCuts->uMask)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmInt.h"
                      ,0xaf,"Mpm_Cut_t *Mpm_CutFetch(Mpm_Man_t *, int)");
      }
      p_04 = Vec_WecEntry(p->vNpnConfigs,uVar12 >> 1 & 0xffffff);
      uVar4 = Vec_IntEntry(p_04,0);
      pAVar7 = Abc_NtkCreateObj(pNtk,ABC_OBJ_NODE);
      pvVar9 = Vec_PtrEntry(p_01,*(uint *)((long)pvVar8 + uVar17 * 8 + 4) >> 1 & 0xffffff);
      (pAVar7->field_5).pData = pvVar9;
      if (pvVar9 == (void *)0x0) {
        __assert_fail("pObj->pData != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmGates.c"
                      ,0xe0,"Abc_Ntk_t *Mpm_ManDeriveMappedAbcNtk(Mpm_Man_t *, Mio_Library_t *)");
      }
      uVar12 = *(uint *)((long)pvVar8 + uVar17 * 8 + 4);
      uVar16 = uVar12 >> 0x19 ^ uVar12;
      uVar14 = uVar4 & 0xffff;
      for (uVar15 = 0; uVar15 < uVar12 >> 0x1b; uVar15 = uVar15 + 1) {
        if (0xb3ff < uVar14) {
          __assert_fail("(Config >> 6) < 720",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmGates.c"
                        ,0xe5,"Abc_Ntk_t *Mpm_ManDeriveMappedAbcNtk(Mpm_Man_t *, Mio_Library_t *)");
        }
        uVar12 = *(uint *)((long)pvVar8 + (long)p->Perm6[uVar14 >> 6][uVar15] * 4 + uVar17 * 8 + 8);
        if ((int)uVar12 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        pAVar10 = Mpm_ManGetAbcNode(pNtk,p_02,uVar12 ^ (uVar14 >> ((uint)uVar15 & 0x1f) & 1) != 0);
        Abc_ObjAddFanin(pAVar7,pAVar10);
        uVar12 = *(uint *)((long)pvVar8 + uVar17 * 8 + 4);
      }
      iVar3 = Abc_Var2Lit(iVar3,(uVar16 ^ uVar4 >> 0x10) & 1);
      Vec_IntWriteEntry(p_02,iVar3,pAVar7->Id);
    }
    for (iVar13 = 0; iVar13 < (p->pMig->vCos).nSize; iVar13 = iVar13 + 1) {
      pMVar6 = Mig_ManCo(p->pMig,iVar13);
      if (pMVar6 == (Mig_Obj_t *)0x0) break;
      iVar2 = 3;
      pAVar7 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
      iVar2 = Mig_ObjFaninLit(pMVar6,iVar2);
      pAVar10 = Mpm_ManGetAbcNode(pNtk,p_02,iVar2);
      Abc_ObjAddFanin(pAVar7,pAVar10);
    }
    Abc_NtkAddDummyPoNames(pNtk);
    Vec_PtrFree(p_01);
    Vec_IntFree(p_03);
    Vec_IntFree(p_02);
  }
  return pNtk;
}

Assistant:

Abc_Ntk_t * Mpm_ManDeriveMappedAbcNtk( Mpm_Man_t * p, Mio_Library_t * pMio )
{
    Abc_Ntk_t * pNtk;
    Vec_Ptr_t * vNpnGatesMio;
    Vec_Int_t * vNodes, * vCopy, * vClass;
    Abc_Obj_t * pObj, * pFanin;
    Mig_Obj_t * pNode;
    Mpm_Cut_t * pCutBest;
    int i, k, iNode, iMigLit, fCompl, Config;

    // find mapping of SCL cells into MIO cells
    vNpnGatesMio = Mpm_ManFindCells( pMio, (SC_Lib *)p->pPars->pScl, p->vNpnConfigs );
    if ( vNpnGatesMio == NULL )
    {
        printf( "Genlib library does not match SCL library.\n" );
        return NULL;
    }

    // create mapping for each phase of each node
    vCopy = Vec_IntStartFull( 2 * Mig_ManObjNum(p->pMig) );

    // get internal nodes
    vNodes = Mpm_ManFindMappedNodes( p );

    // start the network
    pNtk = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_MAP, 1 );
    pNtk->pName = Extra_UtilStrsav( p->pMig->pName );
    pNtk->pManFunc = pMio;

    // create primary inputs
    Mig_ManForEachCi( p->pMig, pNode, i )
    {
        pObj = Abc_NtkCreatePi(pNtk);
        Vec_IntWriteEntry( vCopy, Abc_Var2Lit( Mig_ObjId(pNode), 0 ), Abc_ObjId(pObj) );
    }
    Abc_NtkAddDummyPiNames( pNtk );

    // create constant nodes
    Mig_ManForEachCo( p->pMig, pNode, i )
        if ( Mig_ObjFaninLit(pNode, 0) == 0 )
        {
            pObj = Abc_NtkCreateNodeConst0(pNtk);
            Vec_IntWriteEntry( vCopy, Abc_Var2Lit( 0, 0 ), Abc_ObjId(pObj) );
            break;
        }
    Mig_ManForEachCo( p->pMig, pNode, i )
        if ( Mig_ObjFaninLit(pNode, 0) == 1 )
        {
            pObj = Abc_NtkCreateNodeConst1(pNtk);
            Vec_IntWriteEntry( vCopy, Abc_Var2Lit( 0, 1 ), Abc_ObjId(pObj) );
            break;
        }

    // create internal nodes
    Vec_IntForEachEntry( vNodes, iNode, i )
    {
        pCutBest = Mpm_ObjCutBestP( p, Mig_ManObj(p->pMig, iNode) );
        vClass = Vec_WecEntry( p->vNpnConfigs, Abc_Lit2Var(pCutBest->iFunc) );
        Config = Vec_IntEntry( vClass, 0 );
        pObj = Abc_NtkCreateNode( pNtk );
        pObj->pData = Vec_PtrEntry( vNpnGatesMio, Abc_Lit2Var(pCutBest->iFunc) );
        assert( pObj->pData != NULL );
        fCompl = pCutBest->fCompl ^ Abc_LitIsCompl(pCutBest->iFunc) ^ ((Config >> 16) & 1);
        Config &= 0xFFFF;
        for ( k = 0; k < (int)pCutBest->nLeaves; k++ )
        {
            assert( (Config >> 6) < 720 );
            iMigLit = pCutBest->pLeaves[ (int)(p->Perm6[Config >> 6][k]) ];
            pFanin = Mpm_ManGetAbcNode( pNtk, vCopy, Abc_LitNotCond(iMigLit, (Config >> k) & 1) );
            Abc_ObjAddFanin( pObj, pFanin );
        }
        Vec_IntWriteEntry( vCopy, Abc_Var2Lit(iNode, fCompl), Abc_ObjId(pObj) );
    }

    // create primary outputs
    Mig_ManForEachCo( p->pMig, pNode, i )
    {
        pObj = Abc_NtkCreatePo(pNtk);
        pFanin = Mpm_ManGetAbcNode( pNtk, vCopy, Mig_ObjFaninLit(pNode, 0) );
        Abc_ObjAddFanin( pObj, pFanin );
    }
    Abc_NtkAddDummyPoNames( pNtk );

    // clean up
    Vec_PtrFree( vNpnGatesMio );
    Vec_IntFree( vNodes );
    Vec_IntFree( vCopy );
    return pNtk;
}